

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<unsigned_int> *
wasm::WATParser::tupleArity<wasm::WATParser::ParseDefsCtx>
          (Result<unsigned_int> *__return_storage_ptr__,ParseDefsCtx *ctx)

{
  optional<unsigned_int> oVar1;
  string *this;
  Lexer *this_00;
  string local_80;
  string local_60;
  Err local_40;
  allocator<char> local_19;
  
  this_00 = &ctx->in;
  oVar1 = Lexer::takeU<unsigned_int>(this_00);
  if (((ulong)oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"expected tuple arity",&local_19);
    Lexer::err(&local_40,this_00,&local_80);
    std::__detail::__variant::_Variant_storage<false,unsigned_int,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,unsigned_int,wasm::Err> *)__return_storage_ptr__,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    this = &local_80;
  }
  else {
    if (1 < oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_payload) {
      *(uint *)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
                super__Move_assign_alias<unsigned_int,_wasm::Err>.
                super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                super__Variant_storage_alias<unsigned_int,_wasm::Err> =
           oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>._M_payload;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
               super__Move_assign_alias<unsigned_int,_wasm::Err>.
               super__Copy_assign_alias<unsigned_int,_wasm::Err>.
               super__Move_ctor_alias<unsigned_int,_wasm::Err>.
               super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
               super__Variant_storage_alias<unsigned_int,_wasm::Err> + 0x20) = '\0';
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"tuple arity must be at least 2",&local_19);
    Lexer::err(&local_40,this_00,&local_60);
    std::__detail::__variant::_Variant_storage<false,unsigned_int,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,unsigned_int,wasm::Err> *)__return_storage_ptr__,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    this = &local_60;
  }
  std::__cxx11::string::~string((string *)this);
  return __return_storage_ptr__;
}

Assistant:

Result<uint32_t> tupleArity(Ctx& ctx) {
  auto arity = ctx.in.takeU32();
  if (!arity) {
    return ctx.in.err("expected tuple arity");
  }
  if (*arity < 2) {
    return ctx.in.err("tuple arity must be at least 2");
  }
  return *arity;
}